

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

_Bool uo_cb_init(void)

{
  _Bool _Var1;
  _Bool local_9;
  
  if (is_init) {
    local_9 = true;
  }
  else {
    is_init = true;
    _Var1 = uo_refcount_linkpool_init();
    is_init = (is_init & 1U & _Var1) != 0;
    _Var1 = uo_cb_linkpool_init();
    is_init = (is_init & 1U & _Var1) != 0;
    _Var1 = uo_cb_func_linkpool_init();
    is_init = (is_init & 1U & _Var1) != 0;
    _Var1 = uo_cb_thrd_init();
    is_init = (is_init & 1U & _Var1) != 0;
    atexit(uo_cb_quit);
    _Var1 = uo_cb_queue_init();
    is_init = (is_init & 1U & _Var1) != 0;
    _Var1 = uo_cb_thrdpool_init();
    is_init = (is_init & 1U & _Var1) != 0;
    local_9 = is_init;
  }
  return local_9;
}

Assistant:

bool uo_cb_init() 
{
    if (is_init)
        return true;

    is_init = true;

    is_init &= uo_refcount_linkpool_init();
    is_init &= uo_cb_linkpool_init();
    is_init &= uo_cb_func_linkpool_init();
    is_init &= uo_cb_thrd_init();

    atexit(uo_cb_quit);

    is_init &= uo_cb_queue_init();
    is_init &= uo_cb_thrdpool_init();

    return is_init;
}